

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

bool __thiscall Tester::testDirectory(Tester *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  path *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  recursive_directory_iterator __begin1;
  recursive_directory_iterator __end1;
  int local_13c;
  recursive_directory_iterator local_128;
  recursive_directory_iterator local_110;
  path local_f8;
  recursive_directory_iterator local_b8;
  recursive_directory_iterator local_a0;
  recursive_directory_iterator local_88;
  path local_70;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_f8,path);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  recursive_directory_iterator(&local_128,&local_f8,none,(error_code *)0x0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_f8);
  if (local_128._M_dirs.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_128._M_dirs.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_128._M_dirs.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_128._M_dirs.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_128._M_dirs.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_88._M_options = local_128._M_options;
  local_88._M_pending = local_128._M_pending;
  local_110._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_128._M_dirs.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_110._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_128._M_dirs.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_88._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_88._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110._M_options = local_128._M_options;
  local_110._M_pending = local_128._M_pending;
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_88);
  local_a0._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_128._M_dirs.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_a0._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_128._M_dirs.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_128._M_dirs.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_128._M_dirs.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_128._M_dirs.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_128._M_dirs.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_128._M_dirs.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_a0._M_options = local_128._M_options;
  local_a0._M_pending = local_128._M_pending;
  local_b8._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b8._M_dirs.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8._M_options = none;
  local_b8._M_pending = false;
  local_b8._18_6_ = 0;
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_a0);
  paVar1 = &local_f8._M_pathname.field_2;
  local_13c = 0;
  while (local_110._M_dirs.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi !=
         local_b8._M_dirs.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi) {
    this_00 = (path *)std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
                      operator*(&local_110);
    auVar7 = std::experimental::filesystem::v1::__cxx11::path::_M_find_extension(this_00);
    if (auVar7._8_8_ == -1 || auVar7._0_8_ == 0) {
      local_f8._M_pathname._M_string_length = 0;
      local_f8._M_pathname.field_2._M_local_buf[0] = '\0';
      local_f8._M_cmpts.
      super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_f8._49_8_ = 0;
      local_f8._M_cmpts.
      super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8._M_cmpts.
      super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_f8._M_cmpts.
      super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,auVar7._0_8_);
      std::experimental::filesystem::v1::__cxx11::path::path(&local_f8,&local_70._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_pathname._M_dataplus._M_p != &local_70._M_pathname.field_2) {
        operator_delete(local_70._M_pathname._M_dataplus._M_p,
                        local_70._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::experimental::filesystem::v1::__cxx11::path::
    path<char[6],std::experimental::filesystem::v1::__cxx11::path>(&local_70,(char (*) [6])".flow");
    iVar4 = std::experimental::filesystem::v1::__cxx11::path::compare(&local_f8,&local_70);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_f8);
    if (iVar4 == 0) {
      flow::diagnostics::BufferedReport::clear(&this->report_);
      pcVar2 = (this_00->_M_pathname)._M_dataplus._M_p;
      local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_f8,pcVar2,pcVar2 + (this_00->_M_pathname)._M_string_length);
      bVar3 = testFile(this,&local_f8._M_pathname);
      uVar5 = extraout_XMM0_Da;
      uVar6 = extraout_XMM0_Db;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                        CONCAT71(local_f8._M_pathname.field_2._M_allocated_capacity._1_7_,
                                 local_f8._M_pathname.field_2._M_local_buf[0]) + 1);
        uVar5 = extraout_XMM0_Da_00;
        uVar6 = extraout_XMM0_Db_00;
      }
      if (!bVar3) {
        flow::diagnostics::BufferedReport::log(&this->report_,(double)CONCAT44(uVar6,uVar5));
        local_13c = local_13c + 1;
      }
    }
    std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::operator++(&local_110)
    ;
  }
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_b8);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_110);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_128);
  return local_13c == 0;
}

Assistant:

bool Tester::testDirectory(const std::string& path) {
  int errorCount = 0;
  for (auto& dir : fs::recursive_directory_iterator(path)) {
    if (dir.path().extension() == ".flow") {
      report_.clear();
      if (!testFile(dir.path().string())) {
        report_.log();
        errorCount++;
      }
    }
  }

  return errorCount == 0;
}